

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ExtensionSet::MergeFrom(ExtensionSet *this,ExtensionSet *other)

{
  byte *pbVar1;
  int iVar2;
  long *plVar3;
  byte bVar4;
  _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
  _Var5;
  LogMessage *pLVar6;
  _Base_ptr p_Var7;
  Type *value;
  _Base_ptr p_Var8;
  string *psVar9;
  _Base_ptr p_Var10;
  size_t __n;
  int iVar11;
  void *__src;
  void *__dest;
  long lVar12;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_bool>
  pVar13;
  LogFinisher local_79;
  _Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
  *local_78;
  LogMessage local_70;
  _Rb_tree_node_base *local_38;
  
  p_Var8 = (other->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_38 = &(other->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_78 = (_Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
              *)this;
  if (p_Var8 != local_38) {
    do {
      if (*(char *)((long)&p_Var8[1]._M_left + 1) == '\x01') {
        local_70.level_ = p_Var8[1]._M_color;
        p_Var7 = p_Var8[1]._M_right;
        local_70.filename_ = (char *)0x0;
        local_70.line_ = 0;
        local_70._20_4_ = 0;
        local_70.message_._M_dataplus._M_p = (pointer)0x0;
        pVar13 = std::
                 _Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                 ::
                 _M_emplace_unique<std::pair<int,google::protobuf::internal::ExtensionSet::Extension>>
                           (local_78,(pair<int,_google::protobuf::internal::ExtensionSet::Extension>
                                      *)&local_70);
        _Var5 = pVar13.first._M_node;
        _Var5._M_node[1]._M_right = p_Var7;
        if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          if (*(char *)&_Var5._M_node[1]._M_left != *(char *)&p_Var8[1]._M_left) {
            LogMessage::LogMessage
                      (&local_70,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                       ,0x2ba);
            pLVar6 = LogMessage::operator<<
                               (&local_70,
                                "CHECK failed: (extension->type) == (other_extension.type): ");
            LogFinisher::operator=(&local_79,pLVar6);
            LogMessage::~LogMessage(&local_70);
          }
          if (*(char *)((long)&_Var5._M_node[1]._M_left + 3) !=
              *(char *)((long)&p_Var8[1]._M_left + 3)) {
            LogMessage::LogMessage
                      (&local_70,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                       ,699);
            pLVar6 = LogMessage::operator<<
                               (&local_70,
                                "CHECK failed: (extension->is_packed) == (other_extension.is_packed): "
                               );
            LogFinisher::operator=(&local_79,pLVar6);
            LogMessage::~LogMessage(&local_70);
          }
          if (*(char *)((long)&_Var5._M_node[1]._M_left + 1) == '\0') {
            LogMessage::LogMessage
                      (&local_70,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                       ,700);
            pLVar6 = LogMessage::operator<<(&local_70,"CHECK failed: extension->is_repeated: ");
            LogFinisher::operator=(&local_79,pLVar6);
            LogMessage::~LogMessage(&local_70);
          }
        }
        else {
          *(undefined1 *)&_Var5._M_node[1]._M_left = *(undefined1 *)&p_Var8[1]._M_left;
          *(undefined1 *)((long)&_Var5._M_node[1]._M_left + 3) =
               *(undefined1 *)((long)&p_Var8[1]._M_left + 3);
          *(undefined1 *)((long)&_Var5._M_node[1]._M_left + 1) = 1;
        }
        bVar4 = *(byte *)&p_Var8[1]._M_left;
        if ((byte)(bVar4 - 0x13) < 0xee) {
          LogMessage::LogMessage
                    (&local_70,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                     ,0x35);
          pLVar6 = LogMessage::operator<<
                             (&local_70,
                              "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
          LogFinisher::operator=(&local_79,pLVar6);
          LogMessage::~LogMessage(&local_70);
        }
        switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar4 * 4)) {
        case 1:
        case 8:
          if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            p_Var7 = (_Base_ptr)operator_new(0x10);
            *(undefined8 *)p_Var7 = 0;
            p_Var7->_M_parent = (_Base_ptr)0x0;
            _Var5._M_node[1]._M_parent = p_Var7;
          }
          p_Var7 = p_Var8[1]._M_parent;
          if (*(int *)&p_Var7->_M_parent != 0) {
            p_Var10 = _Var5._M_node[1]._M_parent;
            RepeatedField<int>::Reserve
                      ((RepeatedField<int> *)p_Var10,
                       *(int *)&p_Var7->_M_parent + *(int *)&p_Var10->_M_parent);
LAB_00201fa6:
            __dest = (void *)((long)*(int *)&p_Var10->_M_parent * 4 + *(long *)p_Var10);
            __src = *(void **)p_Var7;
            __n = (long)*(int *)&p_Var7->_M_parent << 2;
LAB_00201fbc:
            memcpy(__dest,__src,__n);
            *(int *)&p_Var10->_M_parent = *(int *)&p_Var10->_M_parent + *(int *)&p_Var7->_M_parent;
          }
          break;
        case 2:
          if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            p_Var7 = (_Base_ptr)operator_new(0x10);
            *(undefined8 *)p_Var7 = 0;
            p_Var7->_M_parent = (_Base_ptr)0x0;
            _Var5._M_node[1]._M_parent = p_Var7;
          }
          p_Var7 = p_Var8[1]._M_parent;
          if (*(int *)&p_Var7->_M_parent != 0) {
            p_Var10 = _Var5._M_node[1]._M_parent;
            RepeatedField<long>::Reserve
                      ((RepeatedField<long> *)p_Var10,
                       *(int *)&p_Var7->_M_parent + *(int *)&p_Var10->_M_parent);
LAB_00201f59:
            __dest = (void *)((long)*(int *)&p_Var10->_M_parent * 8 + *(long *)p_Var10);
            __src = *(void **)p_Var7;
            __n = (long)*(int *)&p_Var7->_M_parent << 3;
            goto LAB_00201fbc;
          }
          break;
        case 3:
          if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            p_Var7 = (_Base_ptr)operator_new(0x10);
            *(undefined8 *)p_Var7 = 0;
            p_Var7->_M_parent = (_Base_ptr)0x0;
            _Var5._M_node[1]._M_parent = p_Var7;
          }
          p_Var7 = p_Var8[1]._M_parent;
          if (*(int *)&p_Var7->_M_parent != 0) {
            p_Var10 = _Var5._M_node[1]._M_parent;
            RepeatedField<unsigned_int>::Reserve
                      ((RepeatedField<unsigned_int> *)p_Var10,
                       *(int *)&p_Var7->_M_parent + *(int *)&p_Var10->_M_parent);
            goto LAB_00201fa6;
          }
          break;
        case 4:
          if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            p_Var7 = (_Base_ptr)operator_new(0x10);
            *(undefined8 *)p_Var7 = 0;
            p_Var7->_M_parent = (_Base_ptr)0x0;
            _Var5._M_node[1]._M_parent = p_Var7;
          }
          p_Var7 = p_Var8[1]._M_parent;
          if (*(int *)&p_Var7->_M_parent != 0) {
            p_Var10 = _Var5._M_node[1]._M_parent;
            RepeatedField<unsigned_long>::Reserve
                      ((RepeatedField<unsigned_long> *)p_Var10,
                       *(int *)&p_Var7->_M_parent + *(int *)&p_Var10->_M_parent);
            goto LAB_00201f59;
          }
          break;
        case 5:
          if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            p_Var7 = (_Base_ptr)operator_new(0x10);
            *(undefined8 *)p_Var7 = 0;
            p_Var7->_M_parent = (_Base_ptr)0x0;
            _Var5._M_node[1]._M_parent = p_Var7;
          }
          p_Var7 = p_Var8[1]._M_parent;
          if (*(int *)&p_Var7->_M_parent != 0) {
            p_Var10 = _Var5._M_node[1]._M_parent;
            RepeatedField<double>::Reserve
                      ((RepeatedField<double> *)p_Var10,
                       *(int *)&p_Var7->_M_parent + *(int *)&p_Var10->_M_parent);
            goto LAB_00201f59;
          }
          break;
        case 6:
          if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            p_Var7 = (_Base_ptr)operator_new(0x10);
            *(undefined8 *)p_Var7 = 0;
            p_Var7->_M_parent = (_Base_ptr)0x0;
            _Var5._M_node[1]._M_parent = p_Var7;
          }
          p_Var7 = p_Var8[1]._M_parent;
          if (*(int *)&p_Var7->_M_parent != 0) {
            p_Var10 = _Var5._M_node[1]._M_parent;
            RepeatedField<float>::Reserve
                      ((RepeatedField<float> *)p_Var10,
                       *(int *)&p_Var7->_M_parent + *(int *)&p_Var10->_M_parent);
            goto LAB_00201fa6;
          }
          break;
        case 7:
          if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            p_Var7 = (_Base_ptr)operator_new(0x10);
            *(undefined8 *)p_Var7 = 0;
            p_Var7->_M_parent = (_Base_ptr)0x0;
            _Var5._M_node[1]._M_parent = p_Var7;
          }
          p_Var7 = p_Var8[1]._M_parent;
          if (*(int *)&p_Var7->_M_parent != 0) {
            p_Var10 = _Var5._M_node[1]._M_parent;
            RepeatedField<bool>::Reserve
                      ((RepeatedField<bool> *)p_Var10,
                       *(int *)&p_Var7->_M_parent + *(int *)&p_Var10->_M_parent);
            __dest = (void *)((long)*(int *)&p_Var10->_M_parent + *(long *)p_Var10);
            __src = *(void **)p_Var7;
            __n = (size_t)*(int *)&p_Var7->_M_parent;
            goto LAB_00201fbc;
          }
          break;
        case 9:
          if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            p_Var7 = _Var5._M_node[1]._M_parent;
          }
          else {
            p_Var7 = (_Base_ptr)operator_new(0x18);
            *(undefined8 *)p_Var7 = 0;
            p_Var7->_M_parent = (_Base_ptr)0x0;
            *(int *)&p_Var7->_M_left = 0;
            _Var5._M_node[1]._M_parent = p_Var7;
          }
          p_Var10 = p_Var8[1]._M_parent;
          RepeatedPtrFieldBase::Reserve
                    ((RepeatedPtrFieldBase *)p_Var7,
                     *(int *)&p_Var10->_M_parent + *(int *)&p_Var7->_M_parent);
          if (0 < *(int *)&p_Var10->_M_parent) {
            lVar12 = 0;
            do {
              iVar2 = *(int *)&p_Var7->_M_parent;
              iVar11 = *(int *)((long)&p_Var7->_M_parent + 4);
              if (iVar2 < iVar11) {
                *(int *)&p_Var7->_M_parent = iVar2 + 1;
                psVar9 = *(string **)(*(long *)p_Var7 + (long)iVar2 * 8);
              }
              else {
                if (iVar11 == *(int *)&p_Var7->_M_left) {
                  RepeatedPtrFieldBase::Reserve((RepeatedPtrFieldBase *)p_Var7,iVar11 + 1);
                  iVar11 = *(int *)((long)&p_Var7->_M_parent + 4);
                }
                *(int *)((long)&p_Var7->_M_parent + 4) = iVar11 + 1;
                psVar9 = StringTypeHandlerBase::New_abi_cxx11_();
                iVar2 = *(int *)&p_Var7->_M_parent;
                *(int *)&p_Var7->_M_parent = iVar2 + 1;
                *(string **)(*(long *)p_Var7 + (long)iVar2 * 8) = psVar9;
              }
              std::__cxx11::string::_M_assign((string *)psVar9);
              lVar12 = lVar12 + 1;
            } while (lVar12 < *(int *)&p_Var10->_M_parent);
          }
          break;
        case 10:
          if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            p_Var7 = (_Base_ptr)operator_new(0x18);
            *(undefined8 *)p_Var7 = 0;
            p_Var7->_M_parent = (_Base_ptr)0x0;
            *(undefined4 *)&p_Var7->_M_left = 0;
            _Var5._M_node[1]._M_parent = p_Var7;
          }
          p_Var7 = p_Var8[1]._M_parent;
          if (0 < *(int *)&p_Var7->_M_parent) {
            lVar12 = 0;
            do {
              plVar3 = *(long **)(*(long *)p_Var7 + lVar12 * 8);
              p_Var10 = _Var5._M_node[1]._M_parent;
              iVar2 = *(int *)&p_Var10->_M_parent;
              if (iVar2 < *(int *)((long)&p_Var10->_M_parent + 4)) {
                *(int *)&p_Var10->_M_parent = iVar2 + 1;
                value = *(Type **)(*(long *)p_Var10 + (long)iVar2 * 8);
                if (value == (Type *)0x0) goto LAB_00201e26;
              }
              else {
LAB_00201e26:
                value = (Type *)(**(code **)(*plVar3 + 0x18))(plVar3);
                RepeatedPtrFieldBase::
                AddAllocated<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                          ((RepeatedPtrFieldBase *)_Var5._M_node[1]._M_parent,value);
              }
              (*value->_vptr_MessageLite[7])(value,plVar3);
              lVar12 = lVar12 + 1;
            } while (lVar12 < *(int *)&p_Var7->_M_parent);
          }
        }
      }
      else if (((ulong)p_Var8[1]._M_left & 0x10000) == 0) {
        bVar4 = *(byte *)&p_Var8[1]._M_left;
        if ((byte)(bVar4 - 0x13) < 0xee) {
          LogMessage::LogMessage
                    (&local_70,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                     ,0x35);
          pLVar6 = LogMessage::operator<<
                             (&local_70,
                              "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
          LogFinisher::operator=(&local_79,pLVar6);
          LogMessage::~LogMessage(&local_70);
        }
        switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar4 * 4)) {
        case 1:
          SetInt32((ExtensionSet *)local_78,p_Var8[1]._M_color,*(FieldType *)&p_Var8[1]._M_left,
                   *(int32 *)&p_Var8[1]._M_parent,(FieldDescriptor *)p_Var8[1]._M_right);
          break;
        case 2:
          SetInt64((ExtensionSet *)local_78,p_Var8[1]._M_color,*(FieldType *)&p_Var8[1]._M_left,
                   (int64)p_Var8[1]._M_parent,(FieldDescriptor *)p_Var8[1]._M_right);
          break;
        case 3:
          SetUInt32((ExtensionSet *)local_78,p_Var8[1]._M_color,*(FieldType *)&p_Var8[1]._M_left,
                    *(uint32 *)&p_Var8[1]._M_parent,(FieldDescriptor *)p_Var8[1]._M_right);
          break;
        case 4:
          SetUInt64((ExtensionSet *)local_78,p_Var8[1]._M_color,*(FieldType *)&p_Var8[1]._M_left,
                    (uint64)p_Var8[1]._M_parent,(FieldDescriptor *)p_Var8[1]._M_right);
          break;
        case 5:
          SetDouble((ExtensionSet *)local_78,p_Var8[1]._M_color,*(FieldType *)&p_Var8[1]._M_left,
                    (double)p_Var8[1]._M_parent,(FieldDescriptor *)p_Var8[1]._M_right);
          break;
        case 6:
          SetFloat((ExtensionSet *)local_78,p_Var8[1]._M_color,*(FieldType *)&p_Var8[1]._M_left,
                   *(float *)&p_Var8[1]._M_parent,(FieldDescriptor *)p_Var8[1]._M_right);
          break;
        case 7:
          SetBool((ExtensionSet *)local_78,p_Var8[1]._M_color,*(FieldType *)&p_Var8[1]._M_left,
                  *(bool *)&p_Var8[1]._M_parent,(FieldDescriptor *)p_Var8[1]._M_right);
          break;
        case 8:
          SetEnum((ExtensionSet *)local_78,p_Var8[1]._M_color,*(FieldType *)&p_Var8[1]._M_left,
                  *(int *)&p_Var8[1]._M_parent,(FieldDescriptor *)p_Var8[1]._M_right);
          break;
        case 9:
          psVar9 = MutableString_abi_cxx11_
                             ((ExtensionSet *)local_78,p_Var8[1]._M_color,
                              *(FieldType *)&p_Var8[1]._M_left,(FieldDescriptor *)p_Var8[1]._M_right
                             );
          std::__cxx11::string::_M_assign((string *)psVar9);
          break;
        case 10:
          local_70.level_ = p_Var8[1]._M_color;
          p_Var7 = p_Var8[1]._M_right;
          local_70.filename_ = (char *)0x0;
          local_70.line_ = 0;
          local_70._20_4_ = 0;
          local_70.message_._M_dataplus._M_p = (pointer)0x0;
          pVar13 = std::
                   _Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                   ::
                   _M_emplace_unique<std::pair<int,google::protobuf::internal::ExtensionSet::Extension>>
                             (local_78,(pair<int,_google::protobuf::internal::ExtensionSet::Extension>
                                        *)&local_70);
          _Var5 = pVar13.first._M_node;
          _Var5._M_node[1]._M_right = p_Var7;
          if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            if (*(char *)&_Var5._M_node[1]._M_left != *(char *)&p_Var8[1]._M_left) {
              LogMessage::LogMessage
                        (&local_70,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                         ,0x319);
              pLVar6 = LogMessage::operator<<
                                 (&local_70,
                                  "CHECK failed: (extension->type) == (other_extension.type): ");
              LogFinisher::operator=(&local_79,pLVar6);
              LogMessage::~LogMessage(&local_70);
            }
            if (*(char *)((long)&_Var5._M_node[1]._M_left + 3) !=
                *(char *)((long)&p_Var8[1]._M_left + 3)) {
              LogMessage::LogMessage
                        (&local_70,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                         ,0x31a);
              pLVar6 = LogMessage::operator<<
                                 (&local_70,
                                  "CHECK failed: (extension->is_packed) == (other_extension.is_packed): "
                                 );
              LogFinisher::operator=(&local_79,pLVar6);
              LogMessage::~LogMessage(&local_70);
            }
            if (*(char *)((long)&_Var5._M_node[1]._M_left + 1) == '\x01') {
              LogMessage::LogMessage
                        (&local_70,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                         ,0x31b);
              pLVar6 = LogMessage::operator<<(&local_70,"CHECK failed: !extension->is_repeated: ");
              LogFinisher::operator=(&local_79,pLVar6);
              LogMessage::~LogMessage(&local_70);
            }
            p_Var7 = _Var5._M_node[1]._M_parent;
            if (((ulong)p_Var8[1]._M_left & 0x100000) == 0) {
              if (((ulong)_Var5._M_node[1]._M_left & 0x100000) != 0) {
                p_Var7 = (_Base_ptr)(**(code **)(*(long *)p_Var7 + 0x20))(p_Var7);
                goto LAB_00202376;
              }
              (**(code **)(*(long *)p_Var7 + 0x38))();
            }
            else {
              if (((ulong)_Var5._M_node[1]._M_left & 0x100000) == 0) {
                p_Var10 = (_Base_ptr)
                          (**(code **)(*(long *)p_Var8[1]._M_parent + 0x18))
                                    (p_Var8[1]._M_parent,p_Var7);
                lVar12 = *(long *)p_Var7;
                goto LAB_00202380;
              }
              (**(code **)(*(long *)p_Var7 + 0x50))(p_Var7);
            }
          }
          else {
            *(undefined1 *)&_Var5._M_node[1]._M_left = *(undefined1 *)&p_Var8[1]._M_left;
            *(undefined1 *)((long)&_Var5._M_node[1]._M_left + 3) =
                 *(undefined1 *)((long)&p_Var8[1]._M_left + 3);
            *(undefined1 *)((long)&_Var5._M_node[1]._M_left + 1) = 0;
            bVar4 = *(byte *)((long)&_Var5._M_node[1]._M_left + 2) & 0xf;
            if (((ulong)p_Var8[1]._M_left & 0x100000) == 0) {
              *(byte *)((long)&_Var5._M_node[1]._M_left + 2) = bVar4;
              p_Var7 = (_Base_ptr)(**(code **)(*(long *)p_Var8[1]._M_parent + 0x18))();
              _Var5._M_node[1]._M_parent = p_Var7;
LAB_00202376:
              p_Var10 = p_Var8[1]._M_parent;
              lVar12 = *(long *)p_Var7;
LAB_00202380:
              (**(code **)(lVar12 + 0x38))(p_Var7,p_Var10);
            }
            else {
              *(byte *)((long)&_Var5._M_node[1]._M_left + 2) = bVar4 | 0x10;
              p_Var7 = (_Base_ptr)(**(code **)(*(long *)p_Var8[1]._M_parent + 0x10))();
              _Var5._M_node[1]._M_parent = p_Var7;
              (**(code **)(*(long *)p_Var7 + 0x50))(p_Var7,p_Var8[1]._M_parent);
            }
          }
          pbVar1 = (byte *)((long)&_Var5._M_node[1]._M_left + 2);
          *pbVar1 = *pbVar1 & 0xf0;
        }
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while (p_Var8 != local_38);
  }
  return;
}

Assistant:

void ExtensionSet::MergeFrom(const ExtensionSet& other) {
  for (map<int, Extension>::const_iterator iter = other.extensions_.begin();
       iter != other.extensions_.end(); ++iter) {
    const Extension& other_extension = iter->second;

    if (other_extension.is_repeated) {
      Extension* extension;
      bool is_new = MaybeNewExtension(iter->first, other_extension.descriptor,
                                      &extension);
      if (is_new) {
        // Extension did not already exist in set.
        extension->type = other_extension.type;
        extension->is_packed = other_extension.is_packed;
        extension->is_repeated = true;
      } else {
        GOOGLE_DCHECK_EQ(extension->type, other_extension.type);
        GOOGLE_DCHECK_EQ(extension->is_packed, other_extension.is_packed);
        GOOGLE_DCHECK(extension->is_repeated);
      }

      switch (cpp_type(other_extension.type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE, REPEATED_TYPE)             \
        case WireFormatLite::CPPTYPE_##UPPERCASE:                    \
          if (is_new) {                                              \
            extension->repeated_##LOWERCASE##_value =                \
              new REPEATED_TYPE;                                     \
          }                                                          \
          extension->repeated_##LOWERCASE##_value->MergeFrom(        \
            *other_extension.repeated_##LOWERCASE##_value);          \
          break;

        HANDLE_TYPE(  INT32,   int32, RepeatedField   <  int32>);
        HANDLE_TYPE(  INT64,   int64, RepeatedField   <  int64>);
        HANDLE_TYPE( UINT32,  uint32, RepeatedField   < uint32>);
        HANDLE_TYPE( UINT64,  uint64, RepeatedField   < uint64>);
        HANDLE_TYPE(  FLOAT,   float, RepeatedField   <  float>);
        HANDLE_TYPE( DOUBLE,  double, RepeatedField   < double>);
        HANDLE_TYPE(   BOOL,    bool, RepeatedField   <   bool>);
        HANDLE_TYPE(   ENUM,    enum, RepeatedField   <    int>);
        HANDLE_TYPE( STRING,  string, RepeatedPtrField< string>);
#undef HANDLE_TYPE

        case WireFormatLite::CPPTYPE_MESSAGE:
          if (is_new) {
            extension->repeated_message_value =
              new RepeatedPtrField<MessageLite>();
          }
          // We can't call RepeatedPtrField<MessageLite>::MergeFrom() because
          // it would attempt to allocate new objects.
          RepeatedPtrField<MessageLite>* other_repeated_message =
              other_extension.repeated_message_value;
          for (int i = 0; i < other_repeated_message->size(); i++) {
            const MessageLite& other_message = other_repeated_message->Get(i);
            MessageLite* target = extension->repeated_message_value
                     ->AddFromCleared<GenericTypeHandler<MessageLite> >();
            if (target == NULL) {
              target = other_message.New();
              extension->repeated_message_value->AddAllocated(target);
            }
            target->CheckTypeAndMergeFrom(other_message);
          }
          break;
      }
    } else {
      if (!other_extension.is_cleared) {
        switch (cpp_type(other_extension.type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE, CAMELCASE)                         \
          case WireFormatLite::CPPTYPE_##UPPERCASE:                          \
            Set##CAMELCASE(iter->first, other_extension.type,                \
                           other_extension.LOWERCASE##_value,                \
                           other_extension.descriptor);                      \
            break;

          HANDLE_TYPE( INT32,  int32,  Int32);
          HANDLE_TYPE( INT64,  int64,  Int64);
          HANDLE_TYPE(UINT32, uint32, UInt32);
          HANDLE_TYPE(UINT64, uint64, UInt64);
          HANDLE_TYPE( FLOAT,  float,  Float);
          HANDLE_TYPE(DOUBLE, double, Double);
          HANDLE_TYPE(  BOOL,   bool,   Bool);
          HANDLE_TYPE(  ENUM,   enum,   Enum);
#undef HANDLE_TYPE
          case WireFormatLite::CPPTYPE_STRING:
            SetString(iter->first, other_extension.type,
                      *other_extension.string_value,
                      other_extension.descriptor);
            break;
          case WireFormatLite::CPPTYPE_MESSAGE: {
            Extension* extension;
            bool is_new = MaybeNewExtension(iter->first,
                                            other_extension.descriptor,
                                            &extension);
            if (is_new) {
              extension->type = other_extension.type;
              extension->is_packed = other_extension.is_packed;
              extension->is_repeated = false;
              if (other_extension.is_lazy) {
                extension->is_lazy = true;
                extension->lazymessage_value =
                    other_extension.lazymessage_value->New();
                extension->lazymessage_value->MergeFrom(
                    *other_extension.lazymessage_value);
              } else {
                extension->is_lazy = false;
                extension->message_value =
                    other_extension.message_value->New();
                extension->message_value->CheckTypeAndMergeFrom(
                    *other_extension.message_value);
              }
            } else {
              GOOGLE_DCHECK_EQ(extension->type, other_extension.type);
              GOOGLE_DCHECK_EQ(extension->is_packed,other_extension.is_packed);
              GOOGLE_DCHECK(!extension->is_repeated);
              if (other_extension.is_lazy) {
                if (extension->is_lazy) {
                  extension->lazymessage_value->MergeFrom(
                      *other_extension.lazymessage_value);
                } else {
                  extension->message_value->CheckTypeAndMergeFrom(
                      other_extension.lazymessage_value->GetMessage(
                          *extension->message_value));
                }
              } else {
                if (extension->is_lazy) {
                  extension->lazymessage_value->MutableMessage(
                      *other_extension.message_value)->CheckTypeAndMergeFrom(
                          *other_extension.message_value);
                } else {
                  extension->message_value->CheckTypeAndMergeFrom(
                      *other_extension.message_value);
                }
              }
            }
            extension->is_cleared = false;
            break;
          }
        }
      }
    }
  }
}